

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall test_soft_max::build_graph(test_soft_max *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  
  pgVar1 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type,4,(this->ne)._M_elems);
  ggml_set_param(ctx,pgVar1);
  ggml_set_name(pgVar1,"a");
  if (this->mask == true) {
    pgVar2 = test_case::ggml_new_tensor_2d
                       (&this->super_test_case,ctx,this->m_prec,(this->ne)._M_elems[0],
                        (this->ne)._M_elems[1]);
    ggml_set_name(pgVar2,"mask");
  }
  else {
    pgVar2 = (ggml_tensor *)0x0;
  }
  pgVar1 = (ggml_tensor *)ggml_soft_max_ext(this->scale,this->max_bias,ctx,pgVar1,pgVar2);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_param(ctx, a);
        ggml_set_name(a, "a");

        ggml_tensor * mask = nullptr;
        if (this->mask) {
            mask = ggml_new_tensor_2d(ctx, m_prec, ne[0], ne[1]);
            ggml_set_name(mask, "mask");
        }

        ggml_tensor * out = ggml_soft_max_ext(ctx, a, mask, scale, max_bias);
        ggml_set_name(out, "out");

        return out;
    }